

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryUtils.hpp
# Opt level: O0

void OpenMD::Utils::
     deletePointers<std::vector<OpenMD::InversionStamp*,std::allocator<OpenMD::InversionStamp*>>>
               (vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                *container)

{
  bool bVar1;
  iterator val;
  InversionStamp **elem;
  iterator __end0;
  iterator __begin0;
  vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_> *__range3;
  vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
  *in_stack_ffffffffffffffd8;
  __normal_iterator<OpenMD::InversionStamp_**,_std::vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (InversionStamp **)
       std::vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>::begin
                 (in_stack_ffffffffffffffd8);
  val = std::vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>::end
                  (in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::InversionStamp_**,_std::vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>_>
                        *)val._M_current,
                       (__normal_iterator<OpenMD::InversionStamp_**,_std::vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>_>
                        *)in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    in_stack_ffffffffffffffd8 =
         (vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_> *)
         __gnu_cxx::
         __normal_iterator<OpenMD::InversionStamp_**,_std::vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>_>
         ::operator*(local_18);
    details::lifted_deleter<OpenMD::InversionStamp*>((InversionStamp *)val._M_current);
    __gnu_cxx::
    __normal_iterator<OpenMD::InversionStamp_**,_std::vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>_>
    ::operator++(local_18);
  }
  return;
}

Assistant:

void deletePointers(Container& container) {
    if constexpr(details::is_container_v<typename Container::value_type>) {
      for (auto& elem : container)
        deletePointers(elem);
    } else {
      for (auto& elem : container)
        details::lifted_deleter(elem);
    }
  }